

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall Assimp::ASEImporter::BuildCameras(ASEImporter *this)

{
  float fVar1;
  pointer pCVar2;
  pointer pCVar3;
  ulong __n;
  aiCamera **ppaVar4;
  aiCamera *paVar5;
  ulong uVar6;
  long lVar7;
  aiScene *paVar8;
  uint uVar9;
  
  pCVar2 = (this->mParser->m_vCameras).
           super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (this->mParser->m_vCameras).
           super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar2 != pCVar3) {
    this->pcScene->mNumCameras = (int)((ulong)((long)pCVar3 - (long)pCVar2) >> 3) * -0x5b05b05b;
    paVar8 = this->pcScene;
    ppaVar4 = (aiCamera **)operator_new__((ulong)paVar8->mNumCameras << 3);
    paVar8->mCameras = ppaVar4;
    paVar8 = this->pcScene;
    if (paVar8->mNumCameras != 0) {
      lVar7 = 0x15c;
      uVar6 = 0;
      do {
        paVar5 = (aiCamera *)operator_new(0x438);
        (paVar5->mName).length = 0;
        (paVar5->mName).data[0] = '\0';
        memset((paVar5->mName).data + 1,0x1b,0x3ff);
        (paVar5->mPosition).x = 0.0;
        (paVar5->mPosition).y = 0.0;
        *(undefined8 *)&(paVar5->mPosition).z = 0;
        (paVar5->mUp).y = 1.0;
        (paVar5->mUp).z = 0.0;
        (paVar5->mLookAt).x = 0.0;
        (paVar5->mLookAt).y = 0.0;
        *(undefined8 *)&(paVar5->mLookAt).z = 0x3f490fdb3f800000;
        paVar5->mClipPlaneNear = 0.1;
        paVar5->mClipPlaneFar = 1000.0;
        paVar5->mAspect = 0.0;
        paVar8->mCameras[uVar6] = paVar5;
        pCVar2 = (this->mParser->m_vCameras).
                 super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        paVar5->mClipPlaneFar = *(float *)((long)&(pCVar2->super_BaseNode).mType + lVar7);
        fVar1 = *(float *)((long)pCVar2 + lVar7 + -4);
        uVar9 = -(uint)(fVar1 != 0.0);
        paVar5->mClipPlaneNear = (float)(~uVar9 & 0x3dcccccd | (uint)fVar1 & uVar9);
        paVar5->mHorizontalFOV = *(float *)((long)pCVar2 + lVar7 + -8);
        __n = *(ulong *)((long)pCVar2 + lVar7 + -0x14c);
        if (__n < 0x400) {
          (paVar5->mName).length = (ai_uint32)__n;
          memcpy((paVar5->mName).data,*(void **)((long)pCVar2 + lVar7 + -0x154),__n);
          (paVar5->mName).data[__n] = '\0';
        }
        uVar6 = uVar6 + 1;
        paVar8 = this->pcScene;
        lVar7 = lVar7 + 0x168;
      } while (uVar6 < paVar8->mNumCameras);
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildCameras()
{
    if (!mParser->m_vCameras.empty())   {
        pcScene->mNumCameras = (unsigned int)mParser->m_vCameras.size();
        pcScene->mCameras = new aiCamera*[pcScene->mNumCameras];

        for (unsigned int i = 0; i < pcScene->mNumCameras;++i)  {
            aiCamera* out = pcScene->mCameras[i] = new aiCamera();
            ASE::Camera& in = mParser->m_vCameras[i];

            // copy members
            out->mClipPlaneFar  = in.mFar;
            out->mClipPlaneNear = (in.mNear ? in.mNear : 0.1f);
            out->mHorizontalFOV = in.mFOV;

            out->mName.Set(in.mName);
        }
    }
}